

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# positional_argument_test.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  testSinglePositionalArgument_NoOtherArguments_ShouldSucceed();
  testSinglePositionalArgument_OtherArgumentsAfter_ShouldSucceed();
  testSinglePositionalArgument_OtherArgumentsAround_ShouldSucceed();
  testSinglePositionalArgument_OtherArgumentsBefore_ShouldSucceed();
  testMultiplePositionalArguments_NoOtherArguments_ShouldSucceed();
  return 0;
}

Assistant:

int main(int, char **)
{
    testSinglePositionalArgument_NoOtherArguments_ShouldSucceed();

    testSinglePositionalArgument_OtherArgumentsAfter_ShouldSucceed();

    testSinglePositionalArgument_OtherArgumentsAround_ShouldSucceed();

    testSinglePositionalArgument_OtherArgumentsBefore_ShouldSucceed();

    testMultiplePositionalArguments_NoOtherArguments_ShouldSucceed();

    return EXIT_SUCCESS;
}